

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void entityTrackingReportStats(XML_Parser rootParser,ENTITY *entity,char *action,int sourceLine)

{
  uint uVar1;
  char *pcVar2;
  
  if (rootParser->m_parentParser == (XML_Parser)0x0) {
    if ((rootParser->m_entity_stats).debugLevel != 0) {
      uVar1 = (rootParser->m_entity_stats).currentDepth;
      pcVar2 = "%";
      if (entity->is_param == '\0') {
        pcVar2 = "&";
      }
      fprintf(_stderr,
              "expat: Entities(%p): Count %9u, depth %2u/%2u %*s%s%s; %s length %d (xmlparse.c:%d)\n"
              ,rootParser,(ulong)(rootParser->m_entity_stats).countEverOpened,(ulong)uVar1,
              (ulong)(rootParser->m_entity_stats).maximumDepthSeen,(ulong)(uVar1 * 2 - 2),"",pcVar2,
              entity->name,action,(ulong)(uint)entity->textLen,(ulong)(uint)sourceLine);
    }
    return;
  }
  __assert_fail("! rootParser->m_parentParser",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                ,0x1f20,"void entityTrackingReportStats(XML_Parser, ENTITY *, const char *, int)");
}

Assistant:

static void
entityTrackingReportStats(XML_Parser rootParser, ENTITY *entity,
                          const char *action, int sourceLine) {
  assert(! rootParser->m_parentParser);
  if (rootParser->m_entity_stats.debugLevel == 0u)
    return;

#  if defined(XML_UNICODE)
  const char *const entityName = "[..]";
#  else
  const char *const entityName = entity->name;
#  endif

  fprintf(
      stderr,
      "expat: Entities(%p): Count %9u, depth %2u/%2u %*s%s%s; %s length %d (xmlparse.c:%d)\n",
      (void *)rootParser, rootParser->m_entity_stats.countEverOpened,
      rootParser->m_entity_stats.currentDepth,
      rootParser->m_entity_stats.maximumDepthSeen,
      (rootParser->m_entity_stats.currentDepth - 1) * 2, "",
      entity->is_param ? "%" : "&", entityName, action, entity->textLen,
      sourceLine);
}